

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_write.cpp
# Opt level: O0

void __thiscall
ritobin::io::impl_binary_write::BinaryWriter::write<float,4ul>
          (BinaryWriter *this,array<float,_4UL> *value)

{
  vector<char,std::allocator<char>> *this_00;
  const_pointer pvVar1;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_38;
  const_iterator local_30;
  undefined8 uStack_28;
  char buffer [16];
  array<float,_4UL> *value_local;
  BinaryWriter *this_local;
  
  buffer._8_8_ = value;
  pvVar1 = std::array<float,_4UL>::data(value);
  uStack_28 = *(undefined8 *)pvVar1;
  buffer._0_8_ = *(undefined8 *)(pvVar1 + 2);
  this_00 = (vector<char,std::allocator<char>> *)this->buffer_;
  local_38._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::end
                         ((vector<char,_std::allocator<char>_> *)this_00);
  __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
  __normal_iterator<char*>
            ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_30,
             &local_38);
  std::vector<char,std::allocator<char>>::insert<char*,void>
            (this_00,local_30,(char *)&uStack_28,buffer + 8);
  return;
}

Assistant:

void write(std::array<T, S> const& value) noexcept {
            static_assert(std::is_arithmetic_v<T>);
            char buffer[sizeof(T) * S];
            memcpy(buffer, value.data(), sizeof(T) * S);
            buffer_.insert(buffer_.end(), buffer, buffer + sizeof(T) * S);
        }